

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ParseField
          (ParserImpl *this,FieldDescriptor *field,Message *output)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  
  iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4);
  iVar3 = (*(output->super_MessageLite)._vptr_MessageLite[0x12])(output);
  if (iVar1 == 10) {
    bVar2 = ConsumeFieldMessage(this,output,(Reflection *)CONCAT44(extraout_var,iVar3),field);
  }
  else {
    bVar2 = ConsumeFieldValue(this,output,(Reflection *)CONCAT44(extraout_var,iVar3),field);
  }
  return (bool)((this->tokenizer_).current_.type == TYPE_END & bVar2);
}

Assistant:

bool ParseField(const FieldDescriptor* field, Message* output) {
    bool suc;
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      suc = ConsumeFieldMessage(output, output->GetReflection(), field);
    } else {
      suc = ConsumeFieldValue(output, output->GetReflection(), field);
    }
    return suc && LookingAtType(io::Tokenizer::TYPE_END);
  }